

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O1

void ERR_restore_state(ERR_SAVE_STATE *state)

{
  ERR_STATE *pEVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if ((state != (ERR_SAVE_STATE *)0x0) && (state->num_errors != 0)) {
    if (state->num_errors < 0x10) {
      pEVar1 = err_get_state();
      if (pEVar1 != (ERR_STATE *)0x0) {
        uVar2 = state->num_errors;
        if (uVar2 != 0) {
          lVar4 = 0;
          uVar3 = 0;
          do {
            err_copy((err_error_st *)((long)&pEVar1->errors[0].file + lVar4),
                     (err_error_st *)((long)&state->errors->file + lVar4));
            uVar3 = uVar3 + 1;
            uVar2 = state->num_errors;
            lVar4 = lVar4 + 0x18;
          } while (uVar3 < uVar2);
        }
        pEVar1->top = (int)uVar2 - 1;
        pEVar1->bottom = 0xf;
      }
      return;
    }
    abort();
  }
  ERR_clear_error();
  return;
}

Assistant:

void ERR_restore_state(const ERR_SAVE_STATE *state) {
  if (state == NULL || state->num_errors == 0) {
    ERR_clear_error();
    return;
  }

  if (state->num_errors >= ERR_NUM_ERRORS) {
    abort();
  }

  ERR_STATE *const dst = err_get_state();
  if (dst == NULL) {
    return;
  }

  for (size_t i = 0; i < state->num_errors; i++) {
    err_copy(&dst->errors[i], &state->errors[i]);
  }
  dst->top = (unsigned)(state->num_errors - 1);
  dst->bottom = ERR_NUM_ERRORS - 1;
}